

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O1

bool __thiscall Game::OnUserUpdate(Game *this,float fElapsedTime)

{
  int64_t *internetPoints;
  StatusBar *this_00;
  SpeechBubble *pSVar1;
  pointer psVar2;
  int iVar3;
  element_type *peVar4;
  ulong uVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  _Alloc_hider internetPoints_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  uint uVar8;
  bool bVar9;
  HWButton HVar10;
  result_type rVar11;
  int iVar12;
  int32_t iVar13;
  int32_t iVar14;
  Pixel PVar15;
  vi2d *pvVar16;
  Decal *pDVar17;
  Sprite *pSVar18;
  ulong uVar19;
  uint *puVar20;
  Renderable *pRVar21;
  ulong __val;
  uint __len;
  float fVar22;
  string __str;
  undefined1 local_2e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  vf2d local_2c8;
  undefined1 local_2c0 [8];
  _Alloc_hider local_2b8;
  vi2d local_2b0;
  undefined1 local_2a8 [16];
  vi2d local_298;
  vi2d local_290;
  vi2d local_288;
  vi2d local_280;
  vi2d local_278;
  shared_ptr<olc::Renderable> local_270;
  shared_ptr<olc::Renderable> local_260;
  shared_ptr<olc::Renderable> local_250;
  shared_ptr<olc::Renderable> local_240;
  undefined1 local_230 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  Sprite *local_210;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_208;
  Wav local_200;
  float local_158;
  vi2d local_154;
  vi2d local_14c;
  SkillTree *local_140;
  vf2d local_138;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  switch(this->state) {
  case MENU:
    pvVar16 = olc::PixelGameEngine::GetMousePos(&this->super_PixelGameEngine);
    iVar12 = pvVar16->x;
    iVar3 = pvVar16->y;
    iVar13 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
    if ((((iVar13 / 2 + -0x32 <= iVar12) &&
         (iVar13 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine),
         iVar12 <= iVar13 / 2 + 0x32)) &&
        (iVar13 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine),
        iVar13 / 2 + -10 <= iVar3)) &&
       (((iVar13 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine),
         iVar3 <= iVar13 / 2 + 10 &&
         (HVar10 = olc::PixelGameEngine::GetMouse(&this->super_PixelGameEngine,0),
         ((uint3)HVar10 & 1) != 0)) && (this->started == false)))) {
      this->started = true;
    }
    if (this->started == true) {
      this->menuFadeTimer = fElapsedTime + this->menuFadeTimer;
    }
    if (2.0 <= this->menuFadeTimer) {
      this->state = FIRST_PHASE;
    }
    iVar13 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
    local_230._0_8_ = &local_220;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_230,"The Great\n   MMO  \n Machine ","");
    olc::PixelGameEngine::GetTextSize((PixelGameEngine *)local_2c0,(string *)this);
    local_2c8.y = 40.0 - (float)(int)local_2c0._4_4_;
    local_2c8.x = (float)(iVar13 / 2) - (float)(int)local_2c0._0_4_;
    local_2e8._0_8_ = &local_2d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2e8,"The Great\n   MMO  \n Machine ","");
    local_138.x = 2.0;
    local_138.y = 2.0;
    olc::PixelGameEngine::DrawStringDecal
              (&this->super_PixelGameEngine,&local_2c8,(string *)local_2e8,(Pixel)olc::BLUE.field_1,
               &local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._0_8_ != &local_2d8) {
      operator_delete((void *)local_2e8._0_8_,local_2d8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._0_8_ != &local_220) {
      operator_delete((void *)local_230._0_8_,local_220._M_allocated_capacity + 1);
    }
    iVar13 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
    iVar14 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
    local_230._4_4_ = (float)(iVar14 / 2) + -10.0;
    local_230._0_4_ = (float)(iVar13 / 2) + -50.0;
    local_2e8._0_4_ = 100.0;
    local_2e8._4_4_ = 20.0;
    olc::PixelGameEngine::FillRectDecal
              (&this->super_PixelGameEngine,(vf2d *)local_230,(vf2d *)local_2e8,
               (Pixel)olc::WHITE.field_1);
    iVar13 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
    iVar14 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
    local_230._0_8_ = &local_220;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"Play","");
    olc::PixelGameEngine::GetTextSize((PixelGameEngine *)local_2c0,(string *)this);
    local_2c8.y = (float)(iVar14 / 2) - (float)((int)local_2c0._4_4_ / 2);
    local_2c8.x = (float)(iVar13 / 2) - (float)((int)local_2c0._0_4_ / 2);
    local_2e8._0_8_ = &local_2d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2e8,"Play","");
    local_138.x = 1.0;
    local_138.y = 1.0;
    olc::PixelGameEngine::DrawStringDecal
              (&this->super_PixelGameEngine,&local_2c8,(string *)local_2e8,(Pixel)olc::BLUE.field_1,
               &local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._0_8_ != &local_2d8) {
      operator_delete((void *)local_2e8._0_8_,local_2d8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._0_8_ != &local_220) {
      operator_delete((void *)local_230._0_8_,local_220._M_allocated_capacity + 1);
    }
    local_230._0_4_ = 0.0;
    local_230._4_4_ = 0.0;
    iVar13 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
    iVar14 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
    local_2e8._4_4_ = (float)iVar14;
    local_2e8._0_4_ = (float)iVar13;
    fVar22 = this->menuFadeTimer * 0.5;
    goto LAB_001174de;
  case FIRST_PHASE:
    switch(this->cutsceneState) {
    case 0:
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Hmm, I really need a new\nvideo idea...","");
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"res/sounds/hmm.wav","");
      iVar13 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
      local_278.y = iVar13 + -0x40;
      local_278.x = 0x46;
      iVar13 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
      local_280.x = iVar13 + -0x4c;
      local_280.y = 0x40;
      local_240.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (this->speechBubbleSprite).
           super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_240.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (this->speechBubbleSprite).
           super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if ((vi2d)local_240.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (vi2d)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)
           ((long)local_240.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi + 8) =
               *(_Atomic_word *)
                ((long)local_240.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)
           ((long)local_240.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi + 8) =
               *(_Atomic_word *)
                ((long)local_240.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 8) + 1;
        }
      }
      SpeechBubble::SpeechBubble
                ((SpeechBubble *)local_230,&local_50,&local_70,&local_278,&local_280,&local_240);
      std::__cxx11::string::operator=((string *)&this->currentSpeechBubble,(string *)local_230);
      _Var7._M_pi = _Stack_208._M_pi;
      pSVar18 = local_210;
      local_210 = (Sprite *)0x0;
      _Stack_208._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var6 = (this->currentSpeechBubble).sprite.
               super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      (this->currentSpeechBubble).sprite.
      super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)pSVar18;
      (this->currentSpeechBubble).sprite.
      super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var7._M_pi;
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
      }
      puVar20 = &local_200.super_AudioSource.mFlags;
      memcpy(&(this->currentSpeechBubble).soundSample.super_AudioSource.mFlags,puVar20,0x90);
      (this->currentSpeechBubble).soundSample.mData = local_200.mData;
      (this->currentSpeechBubble).soundSample.mSampleCount = local_200.mSampleCount;
      (this->currentSpeechBubble).timeElapsed = local_158;
      (this->currentSpeechBubble).position = local_154;
      (this->currentSpeechBubble).scale = local_14c;
      SoLoud::Wav::~Wav(&local_200,(int)puVar20);
      if ((Decal *)_Stack_208._M_pi != (Decal *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_208._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._0_8_ != &local_220) {
        operator_delete((void *)local_230._0_8_,local_220._M_allocated_capacity + 1);
      }
      if ((vi2d)local_240.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (vi2d)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_240.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      SpeechBubble::play(&this->currentSpeechBubble,&this->soloud);
      this->cutsceneState = 1;
      break;
    case 1:
      pSVar1 = &this->currentSpeechBubble;
      fVar22 = SpeechBubble::getTimePastEnd(pSVar1);
      if (3.0 <= fVar22) {
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,"I know, I\'m gonna make an mmo","");
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"res/sounds/iknow.wav","");
        iVar13 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        local_288.y = iVar13 + -0x40;
        local_288.x = 0x46;
        iVar13 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
        local_290.x = iVar13 - 0x4c;
        local_290.y = 0x40;
        local_250.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (this->speechBubbleSprite).
             super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_250.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (this->speechBubbleSprite).
               super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if ((vi2d)local_250.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (vi2d)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)
             ((long)local_250.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi + 8) =
                 *(_Atomic_word *)
                  ((long)local_250.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)
             ((long)local_250.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi + 8) =
                 *(_Atomic_word *)
                  ((long)local_250.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 8) + 1;
          }
        }
        SpeechBubble::SpeechBubble
                  ((SpeechBubble *)local_230,&local_90,&local_b0,&local_288,&local_290,&local_250);
        SpeechBubble::operator=(pSVar1,(SpeechBubble *)local_230);
        SpeechBubble::~SpeechBubble((SpeechBubble *)local_230);
        if ((vi2d)local_250.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (vi2d)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_250.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        SpeechBubble::play(pSVar1,&this->soloud);
        this->cutsceneState = 2;
      }
      break;
    case 2:
      fVar22 = SpeechBubble::getTimePastEnd(&this->currentSpeechBubble);
      if (3.0 <= fVar22) {
        this->cutsceneState = 3;
      }
      break;
    case 3:
      HVar10 = olc::PixelGameEngine::GetKey(&this->super_PixelGameEngine,A);
      if (((uint3)HVar10 & 1) != 0) {
        this->aPressed = true;
      }
      HVar10 = olc::PixelGameEngine::GetKey(&this->super_PixelGameEngine,D);
      if ((((uint3)HVar10 & 1) != 0) && (this->aPressed == true)) {
        StatusBar::addWork(&this->statusBar);
        this->aPressed = false;
        this->pressCounter = this->pressCounter + 1;
      }
      if (this->pressCounter == 0x1e) {
        this->cutsceneState = 4;
      }
      break;
    case 4:
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,"Eugh, this is going slowly","");
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"res/sounds/eughh.wav","")
      ;
      iVar13 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
      local_298.y = iVar13 + -0x40;
      local_298.x = 0x46;
      iVar13 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
      local_2a8._8_4_ = iVar13 + -0x4c;
      local_2a8._12_4_ = 0x40;
      local_260.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (this->speechBubbleSprite).
           super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_260.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (this->speechBubbleSprite).
           super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (local_260.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_260.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_260.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_260.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_260.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      SpeechBubble::SpeechBubble
                ((SpeechBubble *)local_230,&local_d0,&local_f0,&local_298,(vi2d *)(local_2a8 + 8),
                 &local_260);
      std::__cxx11::string::operator=((string *)&this->currentSpeechBubble,(string *)local_230);
      _Var7._M_pi = _Stack_208._M_pi;
      pSVar18 = local_210;
      local_210 = (Sprite *)0x0;
      _Stack_208._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var6 = (this->currentSpeechBubble).sprite.
               super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      (this->currentSpeechBubble).sprite.
      super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)pSVar18;
      (this->currentSpeechBubble).sprite.
      super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var7._M_pi;
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
      }
      puVar20 = &local_200.super_AudioSource.mFlags;
      memcpy(&(this->currentSpeechBubble).soundSample.super_AudioSource.mFlags,puVar20,0x90);
      (this->currentSpeechBubble).soundSample.mData = local_200.mData;
      (this->currentSpeechBubble).soundSample.mSampleCount = local_200.mSampleCount;
      (this->currentSpeechBubble).timeElapsed = local_158;
      (this->currentSpeechBubble).position = local_154;
      (this->currentSpeechBubble).scale = local_14c;
      SoLoud::Wav::~Wav(&local_200,(int)puVar20);
      if ((Decal *)_Stack_208._M_pi != (Decal *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_208._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._0_8_ != &local_220) {
        operator_delete((void *)local_230._0_8_,local_220._M_allocated_capacity + 1);
      }
      if (local_260.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_260.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      SpeechBubble::play(&this->currentSpeechBubble,&this->soloud);
      this->cutsceneState = 5;
      break;
    case 5:
      pSVar1 = &this->currentSpeechBubble;
      fVar22 = SpeechBubble::getTimePastEnd(pSVar1);
      if (3.0 <= fVar22) {
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_110,
                   "I know, I\'m gonna make an mmo\nmaking machine, there\'s no\nway that goes wrong"
                   ,"");
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_130,"res/sounds/mmo.wav","");
        iVar13 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        local_2a8._4_4_ = iVar13 + -0x40;
        local_2a8._0_4_ = 0x46;
        iVar13 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
        local_2b0.x = iVar13 + -0x4c;
        local_2b0.y = 0x40;
        local_270.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (this->speechBubbleSprite).
             super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_270.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (this->speechBubbleSprite).
               super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if ((vi2d)local_270.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (vi2d)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)
             ((long)local_270.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi + 8) =
                 *(_Atomic_word *)
                  ((long)local_270.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)
             ((long)local_270.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi + 8) =
                 *(_Atomic_word *)
                  ((long)local_270.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 8) + 1;
          }
        }
        SpeechBubble::SpeechBubble
                  ((SpeechBubble *)local_230,&local_110,&local_130,(vi2d *)local_2a8,&local_2b0,
                   &local_270);
        SpeechBubble::operator=(pSVar1,(SpeechBubble *)local_230);
        SpeechBubble::~SpeechBubble((SpeechBubble *)local_230);
        if ((vi2d)local_270.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (vi2d)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_270.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        SpeechBubble::play(pSVar1,&this->soloud);
        this->cutsceneState = 6;
      }
      break;
    case 6:
      fVar22 = SpeechBubble::getTimePastEnd(&this->currentSpeechBubble);
      if (3.0 <= fVar22) {
        this->cutsceneState = 7;
      }
      break;
    case 7:
      fVar22 = this->fadeoutTimer + fElapsedTime;
      this->fadeoutTimer = fVar22;
      if (4.0 <= fVar22) {
        this->state = MACHINE;
      }
    }
    SpeechBubble::tick(&this->currentSpeechBubble,fElapsedTime);
    iVar13 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
    local_230._0_8_ = (ulong)(uint)((float)iVar13 + -64.0) << 0x20;
    pDVar17 = olc::Renderable::operator_cast_to_Decal_(&this->javidBaseSprite);
    local_2e8._0_4_ = 2.0;
    local_2e8._4_4_ = 2.0;
    olc::PixelGameEngine::DrawDecal
              (&this->super_PixelGameEngine,(vf2d *)local_230,pDVar17,(vf2d *)local_2e8,
               (Pixel *)&olc::WHITE.field_1);
    if (this->cutsceneState == 3) {
      pRVar21 = &this->aButtonSprite;
      if (this->aPressed == true) {
        iVar13 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
        pSVar18 = olc::Renderable::Sprite(pRVar21);
        iVar12 = pSVar18->width;
        iVar14 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        pSVar18 = olc::Renderable::Sprite(pRVar21);
        local_230._4_4_ = (float)(iVar14 / 2 - pSVar18->height / 2);
        local_230._0_4_ = (float)((iVar13 / 2 - iVar12) + -0x28);
        pDVar17 = olc::Renderable::operator_cast_to_Decal_(&this->aButtonPressedSprite);
        local_2e8._0_4_ = 1.0;
        local_2e8._4_4_ = 1.0;
        olc::PixelGameEngine::DrawDecal
                  (&this->super_PixelGameEngine,(vf2d *)local_230,pDVar17,(vf2d *)local_2e8,
                   (Pixel *)&olc::WHITE.field_1);
        iVar13 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
        iVar14 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        pSVar18 = olc::Renderable::Sprite(&this->dButtonSprite);
        local_230._4_4_ = (float)(iVar14 / 2 - pSVar18->height / 2);
        local_230._0_4_ = (float)(iVar13 / 2 + 0x28);
        pDVar17 = olc::Renderable::operator_cast_to_Decal_(&this->dButtonSprite);
        local_2e8._0_4_ = 1.0;
        local_2e8._4_4_ = 1.0;
        olc::PixelGameEngine::DrawDecal
                  (&this->super_PixelGameEngine,(vf2d *)local_230,pDVar17,(vf2d *)local_2e8,
                   (Pixel *)&olc::WHITE.field_1);
        iVar13 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        local_230._0_8_ = (ulong)(uint)((float)iVar13 + -64.0) << 0x20;
        pDVar17 = olc::Renderable::operator_cast_to_Decal_(&this->javidRArmDownSprite);
        local_2e8._0_4_ = 2.0;
        local_2e8._4_4_ = 2.0;
        olc::PixelGameEngine::DrawDecal
                  (&this->super_PixelGameEngine,(vf2d *)local_230,pDVar17,(vf2d *)local_2e8,
                   (Pixel *)&olc::WHITE.field_1);
        iVar12 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        pRVar21 = &this->javidLArmUpSprite;
      }
      else {
        iVar13 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
        pSVar18 = olc::Renderable::Sprite(pRVar21);
        iVar12 = pSVar18->width;
        iVar14 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        pSVar18 = olc::Renderable::Sprite(pRVar21);
        local_230._4_4_ = (float)(iVar14 / 2 - pSVar18->height / 2);
        local_230._0_4_ = (float)((iVar13 / 2 - iVar12) + -0x28);
        pDVar17 = olc::Renderable::operator_cast_to_Decal_(pRVar21);
        local_2e8._0_4_ = 1.0;
        local_2e8._4_4_ = 1.0;
        olc::PixelGameEngine::DrawDecal
                  (&this->super_PixelGameEngine,(vf2d *)local_230,pDVar17,(vf2d *)local_2e8,
                   (Pixel *)&olc::WHITE.field_1);
        iVar13 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
        iVar14 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        pSVar18 = olc::Renderable::Sprite(&this->dButtonSprite);
        local_230._4_4_ = (float)(iVar14 / 2 - pSVar18->height / 2);
        local_230._0_4_ = (float)(iVar13 / 2 + 0x28);
        pDVar17 = olc::Renderable::operator_cast_to_Decal_(&this->dButtonPressedSprite);
        local_2e8._0_4_ = 1.0;
        local_2e8._4_4_ = 1.0;
        olc::PixelGameEngine::DrawDecal
                  (&this->super_PixelGameEngine,(vf2d *)local_230,pDVar17,(vf2d *)local_2e8,
                   (Pixel *)&olc::WHITE.field_1);
        iVar13 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        local_230._0_8_ = (ulong)(uint)((float)iVar13 + -64.0) << 0x20;
        pDVar17 = olc::Renderable::operator_cast_to_Decal_(&this->javidRArmUpSprite);
        local_2e8._0_4_ = 2.0;
        local_2e8._4_4_ = 2.0;
        olc::PixelGameEngine::DrawDecal
                  (&this->super_PixelGameEngine,(vf2d *)local_230,pDVar17,(vf2d *)local_2e8,
                   (Pixel *)&olc::WHITE.field_1);
        iVar12 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        pRVar21 = &this->javidLArmDownSprite;
      }
      local_230._0_8_ = (ulong)(uint)((float)iVar12 + -64.0) << 0x20;
      pDVar17 = olc::Renderable::operator_cast_to_Decal_(pRVar21);
      local_2e8._0_4_ = 2.0;
      local_2e8._4_4_ = 2.0;
      olc::PixelGameEngine::DrawDecal
                (&this->super_PixelGameEngine,(vf2d *)local_230,pDVar17,(vf2d *)local_2e8,
                 (Pixel *)&olc::WHITE.field_1);
    }
    else {
      iVar13 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
      local_230._0_8_ = (ulong)(uint)((float)iVar13 + -64.0) << 0x20;
      pDVar17 = olc::Renderable::operator_cast_to_Decal_(&this->javidRArmDownSprite);
      local_2e8._0_4_ = 2.0;
      local_2e8._4_4_ = 2.0;
      olc::PixelGameEngine::DrawDecal
                (&this->super_PixelGameEngine,(vf2d *)local_230,pDVar17,(vf2d *)local_2e8,
                 (Pixel *)&olc::WHITE.field_1);
      iVar13 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
      local_230._0_8_ = (ulong)(uint)((float)iVar13 + -64.0) << 0x20;
      pDVar17 = olc::Renderable::operator_cast_to_Decal_(&this->javidLArmDownSprite);
      local_2e8._0_4_ = 2.0;
      local_2e8._4_4_ = 2.0;
      olc::PixelGameEngine::DrawDecal
                (&this->super_PixelGameEngine,(vf2d *)local_230,pDVar17,(vf2d *)local_2e8,
                 (Pixel *)&olc::WHITE.field_1);
      SpeechBubble::drawSelf(&this->currentSpeechBubble,&this->super_PixelGameEngine);
    }
    StatusBar::drawSelf(&this->statusBar,&this->super_PixelGameEngine);
    fVar22 = this->fadeoutTimer;
    if (3.0 <= fVar22) {
      fVar22 = 3.0;
    }
    fVar22 = fVar22 / 3.0;
    local_230._0_4_ = 0.0;
    local_230._4_4_ = 0.0;
    iVar13 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
    local_2b8._M_p._0_4_ = (float)iVar13;
    iVar13 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
    local_2e8._4_4_ = (float)iVar13;
    local_2e8._0_4_ = SUB84(local_2b8._M_p,0);
LAB_001174de:
    PVar15 = olc::PixelF(0.0,0.0,0.0,fVar22);
    olc::PixelGameEngine::FillRectDecal
              (&this->super_PixelGameEngine,(vf2d *)local_230,(vf2d *)local_2e8,PVar15);
    break;
  case MACHINE:
    fVar22 = this->minigameTimer - fElapsedTime;
    this->minigameTimer = fVar22;
    if (fVar22 <= 0.0) {
      this->minigameTimer = 10.0;
      do {
        rVar11 = std::uniform_int_distribution<int>::operator()
                           (&this->minigameDistrib,&this->engine,&(this->minigameDistrib)._M_param);
      } while (rVar11 == this->curMinigameId);
      psVar2 = (this->minigames).
               super__Vector_base<std::shared_ptr<Minigame>,_std::allocator<std::shared_ptr<Minigame>_>_>
               ._M_impl.super__Vector_impl_data._M_start + rVar11;
      (this->currentMinigame).super___shared_ptr<Minigame,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (psVar2->super___shared_ptr<Minigame,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->currentMinigame).super___shared_ptr<Minigame,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 &(psVar2->super___shared_ptr<Minigame,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
      this->curMinigameId = rVar11;
      (**((this->currentMinigame).super___shared_ptr<Minigame,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         _vptr_Minigame)();
    }
    this->armSwitchTimer = this->armSwitchTimer + fElapsedTime;
    this->headBobTimer = this->headBobTimer + fElapsedTime;
    peVar4 = (this->currentMinigame).super___shared_ptr<Minigame,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    internetPoints = &this->internetPoints;
    (*peVar4->_vptr_Minigame[1])(peVar4,this,internetPoints);
    if (this->internetPoints < 0) {
      *internetPoints = 0;
    }
    local_140 = &this->skillTree;
    local_2b8._M_p = (pointer)internetPoints;
    bVar9 = SkillTree::tick(local_140,&this->super_PixelGameEngine,internetPoints);
    if (bVar9) {
      this->armSwitchPeriod = this->armSwitchPeriod * 0.7;
    }
    this_00 = &this->statusBar;
    StatusBar::tick(this_00,&this->super_PixelGameEngine);
    if (this->headBobTimer <= this->headBobPeriod * 0.5) {
      iVar12 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
      pRVar21 = &this->robotBaseSprite0;
    }
    else {
      iVar12 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
      pRVar21 = &this->robotBaseSprite1;
    }
    local_230._0_8_ = (ulong)(uint)((float)iVar12 + -64.0) << 0x20;
    pDVar17 = olc::Renderable::operator_cast_to_Decal_(pRVar21);
    local_2e8._0_4_ = 2.0;
    local_2e8._4_4_ = 2.0;
    olc::PixelGameEngine::DrawDecal
              (&this->super_PixelGameEngine,(vf2d *)local_230,pDVar17,(vf2d *)local_2e8,
               (Pixel *)&olc::WHITE.field_1);
    if (this->headBobPeriod <= this->headBobTimer) {
      this->headBobTimer = this->headBobTimer - this->headBobPeriod;
    }
    if (0.016 <= this->armSwitchPeriod) {
      if (this->armSwitchTimer <= this->armSwitchPeriod * 0.5) {
        iVar13 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        local_230._0_8_ = (ulong)(uint)((float)iVar13 + -64.0) << 0x20;
        pDVar17 = olc::Renderable::operator_cast_to_Decal_(&this->robotRArmDownSprite);
        local_2e8._0_4_ = 2.0;
        local_2e8._4_4_ = 2.0;
        olc::PixelGameEngine::DrawDecal
                  (&this->super_PixelGameEngine,(vf2d *)local_230,pDVar17,(vf2d *)local_2e8,
                   (Pixel *)&olc::WHITE.field_1);
        iVar12 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        pRVar21 = &this->robotLArmUpSprite;
      }
      else {
        iVar13 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        local_230._0_8_ = (ulong)(uint)((float)iVar13 + -64.0) << 0x20;
        pDVar17 = olc::Renderable::operator_cast_to_Decal_(&this->robotRArmUpSprite);
        local_2e8._0_4_ = 2.0;
        local_2e8._4_4_ = 2.0;
        olc::PixelGameEngine::DrawDecal
                  (&this->super_PixelGameEngine,(vf2d *)local_230,pDVar17,(vf2d *)local_2e8,
                   (Pixel *)&olc::WHITE.field_1);
        iVar12 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        pRVar21 = &this->robotLArmDownSprite;
      }
      local_230._0_8_ = (ulong)(uint)((float)iVar12 + -64.0) << 0x20;
      pDVar17 = olc::Renderable::operator_cast_to_Decal_(pRVar21);
    }
    else {
      iVar13 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
      local_230._0_8_ = (ulong)(uint)((float)iVar13 + -64.0) << 0x20;
      iVar12 = rand();
      pDVar17 = olc::Renderable::operator_cast_to_Decal_
                          ((this->fastHandSprites).
                           super__Vector_base<olc::Renderable,_std::allocator<olc::Renderable>_>.
                           _M_impl.super__Vector_impl_data._M_start + iVar12 % 3);
    }
    local_2e8._0_4_ = 2.0;
    local_2e8._4_4_ = 2.0;
    olc::PixelGameEngine::DrawDecal
              (&this->super_PixelGameEngine,(vf2d *)local_230,pDVar17,(vf2d *)local_2e8,
               (Pixel *)&olc::WHITE.field_1);
    while( true ) {
      if (this->armSwitchTimer < this->armSwitchPeriod) break;
      this->armSwitchTimer = this->armSwitchTimer - this->armSwitchPeriod;
      StatusBar::addWork(this_00);
    }
    peVar4 = (this->currentMinigame).super___shared_ptr<Minigame,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    (*peVar4->_vptr_Minigame[2])(peVar4,this);
    local_230._0_4_ = 0.0;
    local_230._4_4_ = 5.0;
    pDVar17 = olc::Renderable::operator_cast_to_Decal_(&this->ipSprite);
    local_2e8._0_4_ = 1.0;
    local_2e8._4_4_ = 1.0;
    olc::PixelGameEngine::DrawDecal
              (&this->super_PixelGameEngine,(vf2d *)local_230,pDVar17,(vf2d *)local_2e8,
               (Pixel *)&olc::WHITE.field_1);
    local_2e8._0_4_ = 16.0;
    local_2e8._4_4_ = 9.0;
    uVar5 = this->internetPoints;
    __val = -uVar5;
    if (0 < (long)uVar5) {
      __val = uVar5;
    }
    __len = 1;
    if (9 < __val) {
      uVar19 = __val;
      uVar8 = 4;
      do {
        __len = uVar8;
        if (uVar19 < 100) {
          __len = __len - 2;
          goto LAB_001165bf;
        }
        if (uVar19 < 1000) {
          __len = __len - 1;
          goto LAB_001165bf;
        }
        if (uVar19 < 10000) goto LAB_001165bf;
        bVar9 = 99999 < uVar19;
        uVar19 = uVar19 / 10000;
        uVar8 = __len + 4;
      } while (bVar9);
      __len = __len + 1;
    }
LAB_001165bf:
    local_230._0_8_ = &local_220;
    std::__cxx11::string::_M_construct((ulong)local_230,(char)__len - (char)((long)uVar5 >> 0x3f));
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)(local_230._0_8_ - ((long)uVar5 >> 0x3f)),__len,__val);
    local_2c8.x = 1.0;
    local_2c8.y = 1.0;
    olc::PixelGameEngine::DrawStringDecal
              (&this->super_PixelGameEngine,(vf2d *)local_2e8,(string *)local_230,
               (Pixel)olc::WHITE.field_1,&local_2c8);
    internetPoints_00._M_p = local_2b8._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._0_8_ != &local_220) {
      operator_delete((void *)local_230._0_8_,local_220._M_allocated_capacity + 1);
    }
    SkillTree::drawSelf(local_140,&this->super_PixelGameEngine,(int64_t *)internetPoints_00._M_p);
    StatusBar::drawSelf(this_00,&this->super_PixelGameEngine);
    bVar9 = StatusBar::done(this_00);
    if (bVar9) {
      this->winFadeTimer = fElapsedTime + this->winFadeTimer;
    }
    local_230._0_4_ = 0.0;
    local_230._4_4_ = 0.0;
    iVar13 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
    iVar14 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
    local_2e8._4_4_ = (float)iVar14;
    local_2e8._0_4_ = (float)iVar13;
    PVar15 = olc::PixelF(0.0,0.0,0.0,this->winFadeTimer * 0.5);
    olc::PixelGameEngine::FillRectDecal
              (&this->super_PixelGameEngine,(vf2d *)local_230,(vf2d *)local_2e8,PVar15);
    if (2.0 <= this->winFadeTimer) {
      this->state = WIN;
    }
    break;
  case WIN:
    local_230._0_4_ = 0.0;
    local_230._4_4_ = 0.0;
    pDVar17 = olc::Renderable::operator_cast_to_Decal_(&this->background);
    local_2e8._0_4_ = 1.0;
    local_2e8._4_4_ = 1.0;
    olc::PixelGameEngine::DrawDecal
              (&this->super_PixelGameEngine,(vf2d *)local_230,pDVar17,(vf2d *)local_2e8,
               (Pixel *)&olc::WHITE.field_1);
  }
  return true;
}

Assistant:

bool Game::OnUserUpdate(float fElapsedTime) {
    switch(state) {
	case CurrentState::MENU:
	    {
		const auto mousePos = GetMousePos();
		if (mousePos.x >= ScreenWidth() / 2 - 50 && mousePos.x <= ScreenWidth() / 2 + 50 &&
			mousePos.y >= ScreenHeight() / 2 - 10 && mousePos.y <= ScreenHeight() / 2 + 10 &&
			GetMouse(0).bPressed &&
			!started) {
		    started = true;
		}
		if (started) {
		    menuFadeTimer += fElapsedTime;
		}
		if (menuFadeTimer >= 2.0f) {
		    state = CurrentState::FIRST_PHASE;
		}
		DrawStringDecal(
			olc::vf2d{float(ScreenWidth() / 2), 40.0f} -
			GetTextSize("The Great\n   MMO  \n Machine "),
			"The Great\n   MMO  \n Machine ",
			olc::BLUE,
			{2.0f, 2.0f});
		FillRectDecal(
			{ScreenWidth() / 2 - 50.0f, ScreenHeight() / 2 - 10.0f},
			{100.0f, 20.0f},
			olc::WHITE);
		DrawStringDecal(
			olc::vf2d{float(ScreenWidth() / 2), float(ScreenHeight() / 2)} -
			GetTextSize("Play") / 2,
			"Play",
			olc::BLUE);
		FillRectDecal({0.0f, 0.0f},
			{float(ScreenWidth()), float(ScreenHeight())},
			olc::PixelF(0.0f, 0.0f, 0.0f, menuFadeTimer / 2));
		break;
	    }
	case CurrentState::FIRST_PHASE:
	    {
		//Update
		switch (cutsceneState) {
		    case 0:
			currentSpeechBubble = SpeechBubble{
			    "Hmm, I really need a new\nvideo idea...",
			    "res/sounds/hmm.wav",
			    {70, ScreenHeight() - 64},
			    {ScreenWidth() - 76, 64},
			    speechBubbleSprite
			};
			currentSpeechBubble.play(soloud);
			cutsceneState = 1;
			break;
		    case 1:
			if (currentSpeechBubble.getTimePastEnd() >= 3) {
			    currentSpeechBubble = SpeechBubble{
				"I know, I'm gonna make an mmo",
				"res/sounds/iknow.wav",
				{70, ScreenHeight() - 64},
				{ScreenWidth() - 76, 64},
				speechBubbleSprite
			    };
			    currentSpeechBubble.play(soloud);
			    cutsceneState = 2;
			}
			break;
		    case 2:
			if (currentSpeechBubble.getTimePastEnd() >= 3) {
			    cutsceneState = 3;
			}
			break;
		    case 3:
			if (GetKey(olc::A).bPressed) {
			    aPressed = true;
			}
			if (GetKey(olc::D).bPressed && aPressed) {
			    statusBar.addWork();
			    aPressed = false;
			    pressCounter++;
			}
			if (pressCounter == 30) {
			    cutsceneState = 4;
			}
			break;
		    case 4:
			currentSpeechBubble = SpeechBubble{
			    "Eugh, this is going slowly",
			    "res/sounds/eughh.wav",
			    {70, ScreenHeight() - 64},
			    {ScreenWidth() - 76, 64},
			    speechBubbleSprite
			};
			currentSpeechBubble.play(soloud);
			cutsceneState = 5;
			break;
		    case 5:
			if (currentSpeechBubble.getTimePastEnd() >= 3) {
			    currentSpeechBubble = SpeechBubble{
				"I know, I'm gonna make an mmo\nmaking machine, there's no\nway that goes wrong",
				"res/sounds/mmo.wav",
				{70, ScreenHeight() - 64},
				{ScreenWidth() - 76, 64},
				speechBubbleSprite
			    };
			    currentSpeechBubble.play(soloud);
			    cutsceneState = 6;
			}
			break;
		    case 6:
			if (currentSpeechBubble.getTimePastEnd() >= 3) {
			    cutsceneState = 7;
			}
			break;
		    case 7:
			fadeoutTimer += fElapsedTime;
			if (fadeoutTimer >= 4.0f) {
			    state = CurrentState::MACHINE;
			}
			break;
		}
		currentSpeechBubble.tick(fElapsedTime);

		//Draw
		DrawDecal({0, ScreenHeight() - 64.0f}, javidBaseSprite, {2, 2});

		if (cutsceneState == 3) {
		    if (aPressed) {
			DrawDecal({float(ScreenWidth() / 2 - 40 - aButtonSprite.Sprite()->width),
				float(ScreenHeight() / 2 - aButtonSprite.Sprite()->height / 2)},
				aButtonPressedSprite);
			DrawDecal({float(ScreenWidth() / 2 + 40),
				float(ScreenHeight() / 2 - dButtonSprite.Sprite()->height / 2)},
				dButtonSprite);
			DrawDecal({0, ScreenHeight() - 64.0f}, javidRArmDownSprite, {2, 2});
			DrawDecal({0, ScreenHeight() - 64.0f}, javidLArmUpSprite, {2, 2});
		    } else {
			DrawDecal({float(ScreenWidth() / 2 - 40 - aButtonSprite.Sprite()->width),
				float(ScreenHeight() / 2 - aButtonSprite.Sprite()->height / 2)},
				aButtonSprite);
			DrawDecal({float(ScreenWidth() / 2 + 40),
				float(ScreenHeight() / 2 - dButtonSprite.Sprite()->height / 2)},
				dButtonPressedSprite);
			DrawDecal({0, ScreenHeight() - 64.0f}, javidRArmUpSprite, {2, 2});
			DrawDecal({0, ScreenHeight() - 64.0f}, javidLArmDownSprite, {2, 2});
		    }
		} else {
		    DrawDecal({0, ScreenHeight() - 64.0f}, javidRArmDownSprite, {2, 2});
		    DrawDecal({0, ScreenHeight() - 64.0f}, javidLArmDownSprite, {2, 2});
		    currentSpeechBubble.drawSelf(this);
		}

		statusBar.drawSelf(this);

		float fadeoutColor = std::min(3.0f, fadeoutTimer) / 3.0f;

		FillRectDecal({0.0f, 0.0f},
			{float(ScreenWidth()), float(ScreenHeight())},
			olc::PixelF(0.0f, 0.0f, 0.0f, fadeoutColor));

		break;
	    }
	case CurrentState::MACHINE:
	    {
		//Update
		minigameTimer -= fElapsedTime;
		if (minigameTimer <= 0.0f) {
		    minigameTimer = 10.0f;
		    int nextMinigame = minigameDistrib(engine);
		    while (nextMinigame == curMinigameId) {
			nextMinigame = minigameDistrib(engine);
		    }
		    currentMinigame = minigames[nextMinigame];
		    curMinigameId = nextMinigame;
		    currentMinigame->start();
		}
		armSwitchTimer += fElapsedTime;
		headBobTimer += fElapsedTime;
		currentMinigame->tick(this, internetPoints);
		if (internetPoints < 0) {
		    internetPoints = 0;
		}
		if (skillTree.tick(this, internetPoints)) {
		    armSwitchPeriod *= 0.7f;
		}
		statusBar.tick(this);
		//Draw
		if (headBobTimer <= headBobPeriod / 2) {
		    DrawDecal({0, ScreenHeight() - 64.0f}, robotBaseSprite0, {2, 2});
		} else {
		    DrawDecal({0, ScreenHeight() - 64.0f}, robotBaseSprite1, {2, 2});
		}
		if (headBobTimer >= headBobPeriod) {
		    headBobTimer -= headBobPeriod;
		}

		if (armSwitchPeriod >= 0.016) {
		    if (armSwitchTimer <= armSwitchPeriod / 2) {
			DrawDecal({0, ScreenHeight() - 64.0f}, robotRArmDownSprite, {2, 2});
			DrawDecal({0, ScreenHeight() - 64.0f}, robotLArmUpSprite, {2, 2});
		    } else {
			DrawDecal({0, ScreenHeight() - 64.0f}, robotRArmUpSprite, {2, 2});
			DrawDecal({0, ScreenHeight() - 64.0f}, robotLArmDownSprite, {2, 2});
		    }
		} else {
		    DrawDecal({0, ScreenHeight() - 64.0f}, fastHandSprites[rand() % 3], {2, 2});
		}
		while (armSwitchTimer >= armSwitchPeriod) {
		    armSwitchTimer -= armSwitchPeriod;
		    statusBar.addWork();
		}

		currentMinigame->drawSelf(this);

		DrawDecal({0, 5}, ipSprite);
		DrawStringDecal({16, 9}, std::to_string(internetPoints));
		
		skillTree.drawSelf(this, internetPoints);
		statusBar.drawSelf(this);

		if (statusBar.done()) {
		    winFadeTimer += fElapsedTime;
		}

		FillRectDecal({0, 0},
			{float(ScreenWidth()), float(ScreenHeight())},
			olc::PixelF(0, 0, 0, winFadeTimer / 2));

		if (winFadeTimer >= 2.0f) {
		    state = CurrentState::WIN;
		}
		break;
	    }
	case CurrentState::WIN:
	    {
		DrawDecal({0, 0}, background);
		break;
	    }
    }
    return true;
}